

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::HasOwnProperty
               (Var instance,PropertyId propertyId,ScriptContext *requestContext,
               PropertyString *propString)

{
  Type *type;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  RecyclableObject *obj;
  PolymorphicInlineCache *pPVar5;
  undefined4 *puVar6;
  uint uVar7;
  undefined1 local_68 [8];
  PropertyDescriptor desc;
  
  bVar2 = TaggedNumber::Is(instance);
  if (bVar2) {
    return 0;
  }
  desc._44_4_ = propertyId;
  obj = UnsafeVarTo<Js::RecyclableObject>(instance);
  bVar2 = VarIs<Js::JavascriptProxy>(instance);
  if (bVar2) {
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_68);
    BVar3 = GetOwnPropertyDescriptor(obj,desc._44_4_,requestContext,(PropertyDescriptor *)local_68);
    return BVar3;
  }
  if (propString == (PropertyString *)0x0) {
    if (obj == (RecyclableObject *)0x0) {
      return 0;
    }
    goto LAB_00997736;
  }
  local_68[0] = CacheType_None;
  local_68[1] = SlotType_None;
  local_68[2] = false;
  pPVar5 = PropertyString::GetLdElemInlineCache(propString);
  bVar2 = PolymorphicInlineCache::PretendTryGetProperty
                    (pPVar5,(obj->type).ptr,(PropertyCacheOperationInfo *)local_68);
  if (bVar2) {
    if (local_68[0] == CacheType_Proto) {
      iVar4 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0xc])(obj,(ulong)(uint)desc._44_4_);
      if (iVar4 == 0) {
        return 0;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      uVar7 = 0x4a1;
LAB_009977f8:
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,uVar7,"(!object->HasOwnProperty(propertyId))",
                                  "!object->HasOwnProperty(propertyId)");
      if (!bVar2) goto LAB_0099786e;
      BVar3 = 0;
      goto LAB_00997859;
    }
    if (local_68[0] != CacheType_Local) goto LAB_009976df;
    iVar4 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0xc])(obj,(ulong)(uint)desc._44_4_);
    if (iVar4 != 0) {
      return 1;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    uVar7 = 0x49e;
  }
  else {
LAB_009976df:
    pPVar5 = PropertyString::GetStElemInlineCache(propString);
    type = (obj->type).ptr;
    bVar2 = PolymorphicInlineCache::PretendTrySetProperty
                      (pPVar5,type,type,(PropertyCacheOperationInfo *)local_68);
    if (!bVar2) {
LAB_00997736:
      iVar4 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0xc])(obj,(ulong)(uint)desc._44_4_);
      return (uint)(iVar4 != 0);
    }
    if (local_68[0] == CacheType_LocalWithoutProperty) {
      iVar4 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0xc])(obj,(ulong)(uint)desc._44_4_);
      if (iVar4 == 0) {
        return 0;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      uVar7 = 0x4b0;
      goto LAB_009977f8;
    }
    if (local_68[0] != CacheType_Local) goto LAB_00997736;
    iVar4 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0xc])(obj,(ulong)(uint)desc._44_4_);
    if (iVar4 != 0) {
      return 1;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    uVar7 = 0x4ad;
  }
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                              ,uVar7,"(object->HasOwnProperty(propertyId))",
                              "object->HasOwnProperty(propertyId)");
  if (!bVar2) {
LAB_0099786e:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  BVar3 = 1;
LAB_00997859:
  *puVar6 = 0;
  return BVar3;
}

Assistant:

BOOL JavascriptOperators::HasOwnProperty(
        Var instance,
        PropertyId propertyId,
        _In_ ScriptContext* requestContext,
        _In_opt_ PropertyString* propString)
    {
        if (TaggedNumber::Is(instance))
        {
            return FALSE;
        }
        RecyclableObject* object = UnsafeVarTo<RecyclableObject>(instance);

        if (VarIs<JavascriptProxy>(instance))
        {
            PropertyDescriptor desc;
            return GetOwnPropertyDescriptor(object, propertyId, requestContext, &desc);
        }

        // If we have a PropertyString, attempt to shortcut the lookup by using its caches
        if (propString != nullptr)
        {
            PropertyCacheOperationInfo info;
            if (propString->GetLdElemInlineCache()->PretendTryGetProperty(object->GetType(), &info))
            {
                switch (info.cacheType)
                {
                case CacheType_Local:
                    Assert(object->HasOwnProperty(propertyId));
                    return TRUE;
                case CacheType_Proto:
                    Assert(!object->HasOwnProperty(propertyId));
                    return FALSE;
                default:
                    // We had a cache hit, but cache doesn't tell us if we have an own property
                    break;
                }
            }
            if (propString->GetStElemInlineCache()->PretendTrySetProperty(object->GetType(), object->GetType(), &info))
            {
                switch (info.cacheType)
                {
                case CacheType_Local:
                    Assert(object->HasOwnProperty(propertyId));
                    return TRUE;
                case CacheType_LocalWithoutProperty:
                    Assert(!object->HasOwnProperty(propertyId));
                    return FALSE;
                default:
                    // We had a cache hit, but cache doesn't tell us if we have an own property
                    break;
                }
            }
        }

        return object && object->HasOwnProperty(propertyId);
    }